

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.hxx
# Opt level: O0

void lineage::validate(ProblemGraph *problemGraph,Solution *solution)

{
  value_type vVar1;
  value_type vVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  ostream *poVar6;
  size_type sVar7;
  size_t sVar8;
  void *pvVar9;
  const_reference pvVar10;
  reference pvVar11;
  Problem *pPVar12;
  const_reference pvVar13;
  pointer pAVar14;
  size_type sVar15;
  size_t __n;
  size_t __n_00;
  EdgeLabels *in_RSI;
  ProblemGraph *in_RDI;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar16;
  deque<unsigned_long,_std::allocator<unsigned_long>_> path;
  size_t v1_3;
  size_t v0_3;
  size_t e_3;
  size_t j_3;
  bool cycleConstraintsSatisfied;
  SubgraphCutTwoFrames subgraph;
  Value v1_2;
  Value e_2;
  AdjacencyIterator it_1;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> ancestorComponents;
  size_t v0_2;
  size_t j_2;
  bool isMoral;
  Value v1_1;
  Value e_1;
  AdjacencyIterator it;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> descendantComponents;
  size_t v0_1;
  size_t j_1;
  size_t v1;
  size_t v0;
  size_t e;
  size_t j;
  bool isMulticut;
  size_t frame;
  SubgraphCutPerFrame subgraphCutPerFrame;
  ComponentLabeling componentsPerFrame;
  SubgraphWithoutCut subgraphCut;
  ComponentLabeling components;
  Problem *problem;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_fffffffffffff8b8;
  ProblemGraph *in_stack_fffffffffffff8c0;
  SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_fffffffffffff8d0;
  Graph *in_stack_fffffffffffff8d8;
  ostream *in_stack_fffffffffffff8e0;
  ostream *in_stack_fffffffffffff8f0;
  ostream *in_stack_fffffffffffff8f8;
  ostream *in_stack_fffffffffffff900;
  SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_fffffffffffff908;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_fffffffffffff910;
  ulong local_1b0;
  SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1a0;
  _Base_ptr local_188;
  undefined1 local_180;
  Value local_178;
  Value local_170;
  Adjacency<unsigned_long> *local_168;
  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  local_160 [7];
  size_t local_128;
  ulong local_120;
  byte local_111;
  _Base_ptr local_110;
  undefined1 local_108;
  Value local_100;
  Value local_f8;
  Adjacency<unsigned_long> *local_f0;
  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  local_e8 [7];
  size_t local_b0;
  ulong local_a8;
  size_t local_a0;
  size_t local_98;
  size_t local_90;
  ulong local_88;
  byte local_79;
  ulong local_78;
  SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  undefined1 local_38 [32];
  Problem *local_18;
  EdgeLabels *local_10;
  ProblemGraph *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = ProblemGraph::problem(in_RDI);
  andres::graph::
  ComponentsBySearch<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_>::
  ComponentsBySearch((ComponentsBySearch<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_>
                      *)in_stack_fffffffffffff8c0);
  validate(lineage::ProblemGraph_const&,lineage::Solution_const&)::SubgraphWithoutCut::
  SubgraphWithoutCut(std::vector<unsigned_char,std::allocator<unsigned_char>_>_const__
            (local_38,local_10);
  ProblemGraph::graph(local_8);
  andres::graph::
  ComponentsBySearch<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>>::
  build<lineage::validate(lineage::ProblemGraph_const&,lineage::Solution_const&)::SubgraphWithoutCut>
            ((ComponentsBySearch<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_>
              *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,
             (SubgraphWithoutCut *)in_stack_fffffffffffff8d0);
  andres::graph::
  ComponentsBySearch<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_>::
  ComponentsBySearch((ComponentsBySearch<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_>
                      *)in_stack_fffffffffffff8c0);
  ProblemGraph::
  SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::SubgraphWithoutCutAndInterFrameEdges(&local_70,local_18,local_10);
  ProblemGraph::graph(local_8);
  andres::graph::
  ComponentsBySearch<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>>::
  build<lineage::ProblemGraph::SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((ComponentsBySearch<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_>
              *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
  poVar6 = std::operator<<((ostream *)&std::cerr,"overall: ");
  sVar7 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::size(&local_18->nodes);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar7);
  poVar6 = std::operator<<(poVar6," nodes, ");
  sVar7 = std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>::size(&local_18->edges);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar7);
  poVar6 = std::operator<<(poVar6," edges");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  for (local_78 = 0; uVar3 = local_78, sVar8 = ProblemGraph::numberOfFrames(local_8), uVar3 < sVar8;
      local_78 = local_78 + 1) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"frame ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_78);
    poVar6 = std::operator<<(poVar6,": ");
    sVar8 = ProblemGraph::numberOfNodesInFrame
                      (in_stack_fffffffffffff8c0,(size_t)in_stack_fffffffffffff8b8);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar8);
    poVar6 = std::operator<<(poVar6," nodes, ");
    sVar8 = ProblemGraph::numberOfEdgesInFrame
                      (in_stack_fffffffffffff8c0,(size_t)in_stack_fffffffffffff8b8);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar8);
    poVar6 = std::operator<<(poVar6," edges");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    if (local_78 != 0) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"   ");
      sVar8 = ProblemGraph::numberOfEdgesFromFrame
                        (in_stack_fffffffffffff8c0,(size_t)in_stack_fffffffffffff8b8);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar8);
      poVar6 = std::operator<<(poVar6," inter-frame edges with frame ");
      pvVar9 = (void *)std::ostream::operator<<(poVar6,local_78 - 1);
      std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    }
    uVar3 = local_78;
    sVar8 = ProblemGraph::numberOfFrames(local_8);
    if (uVar3 != sVar8 - 1) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"   ");
      sVar8 = ProblemGraph::numberOfEdgesFromFrame
                        (in_stack_fffffffffffff8c0,(size_t)in_stack_fffffffffffff8b8);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar8);
      poVar6 = std::operator<<(poVar6," inter-frame edges with frame ");
      pvVar9 = (void *)std::ostream::operator<<(poVar6,local_78 + 1);
      std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    }
    local_79 = 1;
    for (local_88 = 0; uVar3 = local_88,
        sVar8 = ProblemGraph::numberOfEdgesInFrame
                          (in_stack_fffffffffffff8c0,(size_t)in_stack_fffffffffffff8b8),
        uVar3 < sVar8; local_88 = local_88 + 1) {
      local_90 = ProblemGraph::edgeInFrame
                           (in_stack_fffffffffffff8c0,(size_t)in_stack_fffffffffffff8b8,0x14e566);
      ProblemGraph::graph(local_8);
      local_98 = andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::vertexOfEdge
                           ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                            in_stack_fffffffffffff8c0,(size_t)in_stack_fffffffffffff8b8,0x14e5b0);
      ProblemGraph::graph(local_8);
      local_a0 = andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::vertexOfEdge
                           ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                            in_stack_fffffffffffff8c0,(size_t)in_stack_fffffffffffff8b8,0x14e5fb);
      pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          (local_10,local_90);
      vVar1 = *pvVar10;
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&local_60,local_98);
      vVar2 = *pvVar11;
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&local_60,local_a0);
      if ((vVar1 == '\0') != (vVar2 == *pvVar11)) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"   error: the intra-frame edge ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_90);
        poVar6 = std::operator<<(poVar6," between nodes ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_98);
        poVar6 = std::operator<<(poVar6," (t=");
        pPVar12 = ProblemGraph::problem(local_8);
        pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                            (&pPVar12->nodes,local_98);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar13->t);
        poVar6 = std::operator<<(poVar6,", cx=");
        pPVar12 = ProblemGraph::problem(local_8);
        pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                            (&pPVar12->nodes,local_98);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar13->cx);
        poVar6 = std::operator<<(poVar6,", cy=");
        pPVar12 = ProblemGraph::problem(local_8);
        pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                            (&pPVar12->nodes,local_98);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar13->cy);
        poVar6 = std::operator<<(poVar6,", frame component=");
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&local_60,local_98);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar11);
        poVar6 = std::operator<<(poVar6,") and ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_a0);
        poVar6 = std::operator<<(poVar6," (t=");
        pPVar12 = ProblemGraph::problem(local_8);
        pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                            (&pPVar12->nodes,local_a0);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar13->t);
        poVar6 = std::operator<<(poVar6,", cx=");
        pPVar12 = ProblemGraph::problem(local_8);
        pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                            (&pPVar12->nodes,local_a0);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar13->cx);
        poVar6 = std::operator<<(poVar6,", cy=");
        pPVar12 = ProblemGraph::problem(local_8);
        pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                            (&pPVar12->nodes,local_a0);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar13->cy);
        poVar6 = std::operator<<(poVar6,", frame component=");
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&local_60,local_a0);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar11);
        poVar6 = std::operator<<(poVar6,") is part of a violated cycle constraint.");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        local_79 = 0;
      }
    }
    if ((local_79 & 1) != 0) {
      poVar6 = std::operator<<((ostream *)&std::cerr,
                               "   the intra-frame edges labeled 1 well-define a multicut");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    uVar3 = local_78;
    sVar8 = ProblemGraph::numberOfFrames(local_8);
    if (uVar3 < sVar8 - 1) {
      for (local_a8 = 0; uVar3 = local_a8,
          sVar8 = ProblemGraph::numberOfNodesInFrame
                            (in_stack_fffffffffffff8c0,(size_t)in_stack_fffffffffffff8b8),
          uVar3 < sVar8; local_a8 = local_a8 + 1) {
        local_b0 = ProblemGraph::nodeInFrame
                             (in_stack_fffffffffffff8c0,(size_t)in_stack_fffffffffffff8b8,0x14eb31);
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                  ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   0x14eb58);
        ProblemGraph::graph(local_8);
        local_e8[0]._M_current =
             (Adjacency<unsigned_long> *)
             andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
             adjacenciesFromVertexBegin(in_stack_fffffffffffff8b8,0x14eb84);
        while( true ) {
          ProblemGraph::graph(local_8);
          local_f0 = (Adjacency<unsigned_long> *)
                     andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
                     adjacenciesFromVertexEnd(in_stack_fffffffffffff8b8,0x14ebca);
          bVar4 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                              *)in_stack_fffffffffffff8c0,
                             (__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                              *)in_stack_fffffffffffff8b8);
          if (!bVar4) break;
          pAVar14 = __gnu_cxx::
                    __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                    ::operator->(local_e8);
          local_f8 = andres::graph::Adjacency<unsigned_long>::edge(pAVar14);
          pAVar14 = __gnu_cxx::
                    __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                    ::operator->(local_e8);
          local_100 = andres::graph::Adjacency<unsigned_long>::vertex(pAVar14);
          pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                              (&local_18->nodes,local_100);
          if (((long)pvVar13->t == local_78 + 1) &&
             (pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  (local_10,local_f8), *pvVar10 == '\0')) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      (&local_60,local_100);
            pVar16 = std::
                     set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                     insert((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)in_stack_fffffffffffff8e0,
                            (value_type_conflict1 *)in_stack_fffffffffffff8d8);
            local_110 = (_Base_ptr)pVar16.first._M_node;
            local_108 = pVar16.second;
          }
          __gnu_cxx::
          __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
          ::operator++(local_e8);
        }
        sVar15 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                 size((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)0x14ed23);
        if (sVar15 == 0) {
          poVar6 = std::operator<<((ostream *)&std::cerr,"   warning: node ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_b0);
          poVar6 = std::operator<<(poVar6," (t=");
          pPVar12 = ProblemGraph::problem(local_8);
          pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                              (&pPVar12->nodes,local_b0);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar13->t);
          poVar6 = std::operator<<(poVar6,", cx=");
          pPVar12 = ProblemGraph::problem(local_8);
          pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                              (&pPVar12->nodes,local_b0);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar13->cx);
          poVar6 = std::operator<<(poVar6,", cy=");
          pPVar12 = ProblemGraph::problem(local_8);
          pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                              (&pPVar12->nodes,local_b0);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar13->cy);
          poVar6 = std::operator<<(poVar6,", frame component=");
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&local_60,local_b0);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar11);
          poVar6 = std::operator<<(poVar6,") has *no* descendant in frame ");
          pvVar9 = (void *)std::ostream::operator<<(poVar6,local_78 + 1);
          std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
        }
        else {
          sVar15 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   ::size((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)0x14ef1c);
          if (1 < sVar15) {
            poVar6 = std::operator<<((ostream *)&std::cerr,"   warning: node ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_b0);
            poVar6 = std::operator<<(poVar6," (t=");
            pPVar12 = ProblemGraph::problem(local_8);
            pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                                (&pPVar12->nodes,local_b0);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar13->cx);
            poVar6 = std::operator<<(poVar6,", cx=");
            pPVar12 = ProblemGraph::problem(local_8);
            pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                                (&pPVar12->nodes,local_b0);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar13->cx);
            poVar6 = std::operator<<(poVar6,", cy=");
            pPVar12 = ProblemGraph::problem(local_8);
            pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                                (&pPVar12->nodes,local_b0);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar13->cy);
            poVar6 = std::operator<<(poVar6,", frame component=");
            pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (&local_60,local_b0);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar11);
            poVar6 = std::operator<<(poVar6,") has ");
            sVar15 = std::
                     set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                     size((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)0x14f0d9);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar15);
            poVar6 = std::operator<<(poVar6," descendants in frame ");
            pvVar9 = (void *)std::ostream::operator<<(poVar6,local_78 + 1);
            std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
          }
        }
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
                  ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   0x14f15a);
      }
    }
    local_111 = 1;
    if (local_78 != 0) {
      for (local_120 = 0; uVar3 = local_120,
          sVar8 = ProblemGraph::numberOfNodesInFrame
                            (in_stack_fffffffffffff8c0,(size_t)in_stack_fffffffffffff8b8),
          uVar3 < sVar8; local_120 = local_120 + 1) {
        local_128 = ProblemGraph::nodeInFrame
                              (in_stack_fffffffffffff8c0,(size_t)in_stack_fffffffffffff8b8,0x14f1fd)
        ;
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                  ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   0x14f224);
        ProblemGraph::graph(local_8);
        local_160[0]._M_current =
             (Adjacency<unsigned_long> *)
             andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
             adjacenciesFromVertexBegin(in_stack_fffffffffffff8b8,0x14f250);
        while( true ) {
          ProblemGraph::graph(local_8);
          local_168 = (Adjacency<unsigned_long> *)
                      andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
                      adjacenciesFromVertexEnd(in_stack_fffffffffffff8b8,0x14f296);
          bVar4 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                              *)in_stack_fffffffffffff8c0,
                             (__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                              *)in_stack_fffffffffffff8b8);
          if (!bVar4) break;
          pAVar14 = __gnu_cxx::
                    __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                    ::operator->(local_160);
          local_170 = andres::graph::Adjacency<unsigned_long>::edge(pAVar14);
          pAVar14 = __gnu_cxx::
                    __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                    ::operator->(local_160);
          local_178 = andres::graph::Adjacency<unsigned_long>::vertex(pAVar14);
          pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                              (&local_18->nodes,local_178);
          if (((long)pvVar13->t == local_78 - 1) &&
             (pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  (local_10,local_170), *pvVar10 == '\0')) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      (&local_60,local_178);
            pVar16 = std::
                     set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                     insert((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)in_stack_fffffffffffff8e0,
                            (value_type_conflict1 *)in_stack_fffffffffffff8d8);
            local_188 = (_Base_ptr)pVar16.first._M_node;
            local_180 = pVar16.second;
            sVar15 = std::
                     set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                     size((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)0x14f3b7);
            if (1 < sVar15) {
              local_111 = 0;
              poVar6 = std::operator<<((ostream *)&std::cerr,"   error: morality violated at node ")
              ;
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_128);
              poVar6 = std::operator<<(poVar6," (t=");
              pPVar12 = ProblemGraph::problem(local_8);
              pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                                  (&pPVar12->nodes,local_128);
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar13->t);
              poVar6 = std::operator<<(poVar6,", cx=");
              pPVar12 = ProblemGraph::problem(local_8);
              pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                                  (&pPVar12->nodes,local_128);
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar13->cx);
              poVar6 = std::operator<<(poVar6,", cy=");
              pPVar12 = ProblemGraph::problem(local_8);
              pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                                  (&pPVar12->nodes,local_128);
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar13->cy);
              poVar6 = std::operator<<(poVar6,", frame component=");
              pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  (&local_60,local_128);
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar11);
              poVar6 = std::operator<<(poVar6,")");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            }
          }
          __gnu_cxx::
          __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
          ::operator++(local_160);
        }
        sVar15 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                 size((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)0x14f5cf);
        if (sVar15 == 0) {
          poVar6 = std::operator<<((ostream *)&std::cerr,"   warning: node ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_128);
          poVar6 = std::operator<<(poVar6," (t=");
          pPVar12 = ProblemGraph::problem(local_8);
          pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                              (&pPVar12->nodes,local_128);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar13->t);
          poVar6 = std::operator<<(poVar6,", cx=");
          pPVar12 = ProblemGraph::problem(local_8);
          pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                              (&pPVar12->nodes,local_128);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar13->cx);
          poVar6 = std::operator<<(poVar6,", cy=");
          pPVar12 = ProblemGraph::problem(local_8);
          pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                              (&pPVar12->nodes,local_128);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar13->cy);
          poVar6 = std::operator<<(poVar6,", frame component=");
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&local_60,local_128);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar11);
          poVar6 = std::operator<<(poVar6,") has no ancestor in frame ");
          pvVar9 = (void *)std::ostream::operator<<(poVar6,local_78 - 1);
          std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
        }
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
                  ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   0x14f7c5);
      }
      if ((local_111 & 1) != 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "   labeling of incoming inter-frame edges is moral");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
    }
    if (local_78 != 0) {
      ProblemGraph::
      SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      SubgraphOfTwoFramesWithoutCut(&local_1a0,local_18,local_10,local_78 - 1);
      bVar4 = true;
      for (local_1b0 = 0;
          sVar8 = ProblemGraph::numberOfEdgesFromFrame
                            (in_stack_fffffffffffff8c0,(size_t)in_stack_fffffffffffff8b8),
          local_1b0 < sVar8; local_1b0 = local_1b0 + 1) {
        sVar8 = ProblemGraph::edgeFromFrame
                          (in_stack_fffffffffffff8c0,(size_t)in_stack_fffffffffffff8b8,0x14f8d7);
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            (local_10,sVar8);
        if (*pvVar10 == '\x01') {
          ProblemGraph::graph(local_8);
          __n = andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::vertexOfEdge
                          ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                           in_stack_fffffffffffff8c0,(size_t)in_stack_fffffffffffff8b8,0x14f942);
          ProblemGraph::graph(local_8);
          __n_00 = andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
                   vertexOfEdge((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                                in_stack_fffffffffffff8c0,(size_t)in_stack_fffffffffffff8b8,0x14f98d
                               );
          std::deque<unsigned_long,_std::allocator<unsigned_long>_>::deque
                    ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)0x14f9b4);
          ProblemGraph::graph(local_8);
          bVar5 = andres::graph::
                  spsp<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>,lineage::ProblemGraph::SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            (in_stack_fffffffffffff910,in_stack_fffffffffffff908,
                             (size_t)in_stack_fffffffffffff900,(size_t)in_stack_fffffffffffff8f8,
                             (deque<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffff8f0);
          if (bVar5) {
            bVar4 = false;
            poVar6 = std::operator<<((ostream *)&std::cerr,"   error: the inter-frame edge ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar8);
            poVar6 = std::operator<<(poVar6," between nodes ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,__n);
            poVar6 = std::operator<<(poVar6," (t=");
            pPVar12 = ProblemGraph::problem(local_8);
            pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                                (&pPVar12->nodes,__n);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar13->t);
            poVar6 = std::operator<<(poVar6,", cx=");
            pPVar12 = ProblemGraph::problem(local_8);
            pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                                (&pPVar12->nodes,__n);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar13->cx);
            poVar6 = std::operator<<(poVar6,", cy=");
            pPVar12 = ProblemGraph::problem(local_8);
            pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                                (&pPVar12->nodes,__n);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar13->cy);
            poVar6 = std::operator<<(poVar6,", frame component=");
            pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (&local_60,__n);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar11);
            in_stack_fffffffffffff910 =
                 (Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                 std::operator<<(poVar6,") and ");
            in_stack_fffffffffffff908 =
                 (SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)std::ostream::operator<<(in_stack_fffffffffffff910,__n_00);
            in_stack_fffffffffffff900 = std::operator<<((ostream *)in_stack_fffffffffffff908," (t=")
            ;
            pPVar12 = ProblemGraph::problem(local_8);
            pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                                (&pPVar12->nodes,__n_00);
            in_stack_fffffffffffff8f8 =
                 (ostream *)std::ostream::operator<<(in_stack_fffffffffffff900,pvVar13->t);
            in_stack_fffffffffffff8f0 = std::operator<<(in_stack_fffffffffffff8f8,", cx=");
            pPVar12 = ProblemGraph::problem(local_8);
            pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                                (&pPVar12->nodes,__n_00);
            poVar6 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffff8f0,pvVar13->cx);
            in_stack_fffffffffffff8e0 = std::operator<<(poVar6,", cy=");
            pPVar12 = ProblemGraph::problem(local_8);
            pvVar13 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                                (&pPVar12->nodes,__n_00);
            in_stack_fffffffffffff8d8 =
                 (Graph *)std::ostream::operator<<(in_stack_fffffffffffff8e0,pvVar13->cy);
            poVar6 = std::operator<<((ostream *)in_stack_fffffffffffff8d8,", frame component=");
            pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (&local_60,__n_00);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar11);
            in_stack_fffffffffffff8c0 =
                 (ProblemGraph *)
                 std::operator<<(poVar6,") is part of a violated inter-frame cycle constraint.");
            std::ostream::operator<<
                      (in_stack_fffffffffffff8c0,std::endl<char,std::char_traits<char>>);
          }
          std::deque<unsigned_long,_std::allocator<unsigned_long>_>::~deque
                    ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffff900);
        }
      }
      if (bVar4) {
        in_stack_fffffffffffff8b8 =
             (Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
             std::operator<<((ostream *)&std::cerr,
                             "   labeling of incoming inter-frame edges satisfies cycle constraints"
                            );
        std::ostream::operator<<(in_stack_fffffffffffff8b8,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  andres::graph::
  ComponentsBySearch<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_>::
  ~ComponentsBySearch((ComponentsBySearch<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_>
                       *)0x14fdf7);
  andres::graph::
  ComponentsBySearch<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_>::
  ~ComponentsBySearch((ComponentsBySearch<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_>
                       *)0x14fe04);
  return;
}

Assistant:

inline
void validate(ProblemGraph const& problemGraph, Solution const& solution)
{
    struct SubgraphWithoutCut
    {
        SubgraphWithoutCut(lineage::Solution::EdgeLabels const& edgeLabels) :
            edgeLabels_(edgeLabels)
        {}
        
        bool vertex(size_t i) const
        { 
            return true;
        }
        
        bool edge(size_t i) const
        {
            return edgeLabels_[i] == 0;
        }

        lineage::Solution::EdgeLabels const& edgeLabels_;
    };

    typedef ProblemGraph::SubgraphWithoutCutAndInterFrameEdges<lineage::Solution::EdgeLabels> SubgraphCutPerFrame;
    typedef ProblemGraph::SubgraphOfTwoFramesWithoutCut<lineage::Solution::EdgeLabels> SubgraphCutTwoFrames;
    typedef andres::graph::ComponentsBySearch<ProblemGraph::Graph> ComponentLabeling;

    Problem const& problem = problemGraph.problem();

    ComponentLabeling components;
    SubgraphWithoutCut subgraphCut(solution.edge_labels);
    components.build(problemGraph.graph(), subgraphCut);

    ComponentLabeling componentsPerFrame;
    SubgraphCutPerFrame subgraphCutPerFrame(problem, solution.edge_labels);
    componentsPerFrame.build(problemGraph.graph(), subgraphCutPerFrame);

    // print numbers of nodes and edges
    std::cerr << "overall: " << problem.nodes.size()
        << " nodes, " << problem.edges.size()
        << " edges" << std::endl;

    for (size_t frame = 0; frame < problemGraph.numberOfFrames(); ++frame)
    {
        std::cerr << "frame " << frame
            << ": " << problemGraph.numberOfNodesInFrame(frame)
            << " nodes, " << problemGraph.numberOfEdgesInFrame(frame)
            << " edges" << std::endl;

        if (frame != 0)
            std::cerr << "   " << problemGraph.numberOfEdgesFromFrame(frame-1)
                << " inter-frame edges with frame " << frame - 1
                << std::endl;
        
        if (frame != problemGraph.numberOfFrames() - 1)
            std::cerr << "   " << problemGraph.numberOfEdgesFromFrame(frame)
                << " inter-frame edges with frame " << frame + 1
                << std::endl;

        // test whether edges labeled 1 well-define a multicut
        bool isMulticut = true;
        for (size_t j = 0; j < problemGraph.numberOfEdgesInFrame(frame); ++j)
        {
            auto e = problemGraph.edgeInFrame(frame, j);

            auto v0 = problemGraph.graph().vertexOfEdge(e, 0);
            auto v1 = problemGraph.graph().vertexOfEdge(e, 1);

            if ((solution.edge_labels[e] == 0) != (componentsPerFrame.labels_[v0] == componentsPerFrame.labels_[v1]))
            {
                std::cerr << "   error: the intra-frame edge " << e
                    << " between nodes " << v0
                    << " (t=" << problemGraph.problem().nodes[v0].t
                    << ", cx=" << problemGraph.problem().nodes[v0].cx
                    << ", cy=" << problemGraph.problem().nodes[v0].cy
                    << ", frame component=" << componentsPerFrame.labels_[v0]
                    << ") and " << v1
                    << " (t=" << problemGraph.problem().nodes[v1].t
                    << ", cx=" << problemGraph.problem().nodes[v1].cx
                    << ", cy=" << problemGraph.problem().nodes[v1].cy
                    << ", frame component=" << componentsPerFrame.labels_[v1]
                    << ") is part of a violated cycle constraint."
                    << std::endl;

                isMulticut = false;
            }
        }

        if (isMulticut)
            std::cerr << "   the intra-frame edges labeled 1 well-define a multicut" << std::endl;

        // report splits and nodes without descendants
        if (frame < problemGraph.numberOfFrames() - 1)
            for (size_t j = 0; j < problemGraph.numberOfNodesInFrame(frame); ++j)
            {
                auto v0 = problemGraph.nodeInFrame(frame, j);

                std::set<size_t> descendantComponents;
                for (auto it = problemGraph.graph().adjacenciesFromVertexBegin(v0); it != problemGraph.graph().adjacenciesFromVertexEnd(v0); ++it)
                {
                    auto e = it->edge();
                    auto v1 = it->vertex();

                    if (problem.nodes[v1].t == frame + 1 && solution.edge_labels[e] == 0)
                        descendantComponents.insert(componentsPerFrame.labels_[v1]);
                }

                if (descendantComponents.size() == 0)
                    std::cerr << "   warning: node " << v0
                        << " (t=" << problemGraph.problem().nodes[v0].t
                        << ", cx=" << problemGraph.problem().nodes[v0].cx
                        << ", cy=" << problemGraph.problem().nodes[v0].cy
                        << ", frame component=" << componentsPerFrame.labels_[v0]
                        << ") has *no* descendant in frame " << frame + 1
                        << std::endl;
                else if (descendantComponents.size() > 1)
                    std::cerr << "   warning: node " << v0
                        << " (t=" << problemGraph.problem().nodes[v0].cx
                        << ", cx=" << problemGraph.problem().nodes[v0].cx
                        << ", cy=" << problemGraph.problem().nodes[v0].cy
                        << ", frame component=" << componentsPerFrame.labels_[v0]
                        << ") has " << descendantComponents.size()
                        << " descendants in frame " << frame + 1
                        << std::endl;
            }

        // test morality and report nodes without ancestors
        bool isMoral = true;
        if (frame != 0)
        {
            for (size_t j = 0; j < problemGraph.numberOfNodesInFrame(frame); ++j)
            {
                auto v0 = problemGraph.nodeInFrame(frame, j);

                std::set<size_t> ancestorComponents;
                for (auto it = problemGraph.graph().adjacenciesFromVertexBegin(v0); it != problemGraph.graph().adjacenciesFromVertexEnd(v0); ++it)
                {
                    auto e = it->edge();
                    auto v1 = it->vertex();
                    
                    if (problem.nodes[v1].t == frame - 1 && solution.edge_labels[e] == 0)
                    {
                        ancestorComponents.insert(componentsPerFrame.labels_[v1]);

                        if (ancestorComponents.size() > 1)
                        {
                            isMoral = false;

                            std::cerr << "   error: morality violated at node " << v0
                                << " (t=" << problemGraph.problem().nodes[v0].t
                                << ", cx=" << problemGraph.problem().nodes[v0].cx
                                << ", cy=" << problemGraph.problem().nodes[v0].cy
                                << ", frame component=" << componentsPerFrame.labels_[v0]
                                << ")" << std::endl;
                        }
                    }
                }

                if (ancestorComponents.size() == 0)
                    std::cerr << "   warning: node " << v0
                        << " (t=" << problemGraph.problem().nodes[v0].t
                        << ", cx=" << problemGraph.problem().nodes[v0].cx
                        << ", cy=" << problemGraph.problem().nodes[v0].cy
                        << ", frame component=" << componentsPerFrame.labels_[v0]
                        << ") has no ancestor in frame " << frame - 1
                        << std::endl;
            }
            
            if (isMoral)
                std::cerr << "   labeling of incoming inter-frame edges is moral" << std::endl;
        }

        // test cycle constraints of inter-frame edges
        if (frame != 0)
        {
            SubgraphCutTwoFrames subgraph(problem, solution.edge_labels, frame - 1);

            bool cycleConstraintsSatisfied = true;
            for (size_t j = 0; j < problemGraph.numberOfEdgesFromFrame(frame - 1); ++j)
            {
                auto e = problemGraph.edgeFromFrame(frame - 1, j);

                if (solution.edge_labels[e] == 1) // cut
                {
                    auto v0 = problemGraph.graph().vertexOfEdge(e, 0);
                    auto v1 = problemGraph.graph().vertexOfEdge(e, 1);
                    
                    std::deque<std::size_t> path;
                    if (andres::graph::spsp(problemGraph.graph(), subgraph, v0, v1, path) == true)
                    {
                        cycleConstraintsSatisfied = false;

                        std::cerr << "   error: the inter-frame edge " << e
                            << " between nodes " << v0
                            << " (t=" << problemGraph.problem().nodes[v0].t
                            << ", cx=" << problemGraph.problem().nodes[v0].cx
                            << ", cy=" << problemGraph.problem().nodes[v0].cy
                            << ", frame component=" << componentsPerFrame.labels_[v0]
                            << ") and " << v1
                            << " (t=" << problemGraph.problem().nodes[v1].t
                            << ", cx=" << problemGraph.problem().nodes[v1].cx
                            << ", cy=" << problemGraph.problem().nodes[v1].cy
                            << ", frame component=" << componentsPerFrame.labels_[v1]
                            << ") is part of a violated inter-frame cycle constraint."
                            << std::endl;
                    }
                }
            }

            if (cycleConstraintsSatisfied)
                std::cerr << "   labeling of incoming inter-frame edges satisfies cycle constraints" << std::endl;
        }
    }
}